

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O0

mk_iov * mk_iov_realloc(mk_iov *mk_io,int new_size)

{
  mk_iov *iov;
  int i;
  int new_size_local;
  mk_iov *mk_io_local;
  
  mk_io_local = mk_iov_create(new_size,0);
  if (mk_io_local == (mk_iov *)0x0) {
    mk_io_local = (mk_iov *)0x0;
  }
  else {
    mk_io_local->iov_idx = mk_io->iov_idx;
    mk_io_local->buf_idx = mk_io->buf_idx;
    mk_io_local->size = new_size;
    mk_io_local->total_len = mk_io->total_len;
    for (iov._0_4_ = 0; (int)iov < mk_io->iov_idx; iov._0_4_ = (int)iov + 1) {
      mk_io_local->io[(int)iov].iov_base = mk_io->io[(int)iov].iov_base;
      mk_io_local->io[(int)iov].iov_len = mk_io->io[(int)iov].iov_len;
    }
    for (iov._0_4_ = 0; (int)iov < mk_io->buf_idx; iov._0_4_ = (int)iov + 1) {
      mk_io_local->buf_to_free[(int)iov] = mk_io->buf_to_free[(int)iov];
    }
  }
  return mk_io_local;
}

Assistant:

struct mk_iov *mk_iov_realloc(struct mk_iov *mk_io, int new_size)
{
    int i;
    struct mk_iov *iov;

    /*
     * We do not perform a memory realloc because our struct iov have
     * self references on it 'io' and 'buf_to_free' pointers. So we create a
     * new mk_iov and perform a data migration.
     */
    iov = mk_iov_create(new_size, 0);
    if (!iov) {
        return NULL;
    }

    /* Migrate data */
    iov->iov_idx   = mk_io->iov_idx;
    iov->buf_idx   = mk_io->buf_idx;
    iov->size      = new_size;
    iov->total_len = mk_io->total_len;

    for (i = 0; i < mk_io->iov_idx; i++) {
        iov->io[i].iov_base = mk_io->io[i].iov_base;
        iov->io[i].iov_len  = mk_io->io[i].iov_len;
    }

    for (i = 0; i < mk_io->buf_idx; i++) {
        iov->buf_to_free[i] = mk_io->buf_to_free[i];
    }

    return iov;
}